

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

Vector * Utils::SolveUpperTriangle(Vector *__return_storage_ptr__,Matrix *m,Vector *b)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  int i;
  size_type __n;
  size_type sVar4;
  double dVar5;
  allocator_type local_51;
  double local_50;
  double local_48;
  size_type local_40;
  Vector *local_38;
  
  local_38 = b;
  iVar3 = Matrix::GetCols(m);
  __n = (size_type)iVar3;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_51);
  local_40 = __n;
  if (0 < iVar3) {
    do {
      sVar1 = __n - 1;
      local_48 = 0.0;
      i = (int)sVar1;
      sVar4 = __n;
      if ((long)__n < (long)local_40) {
        do {
          local_50 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start[sVar4];
          dVar5 = Matrix::operator()(m,i,(int)sVar4);
          local_48 = local_48 + local_50 * dVar5;
          sVar4 = sVar4 + 1;
        } while ((int)sVar4 < iVar3);
      }
      local_50 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[sVar1];
      dVar5 = Matrix::operator()(m,i,i);
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar1] = (local_50 - local_48) / dVar5;
      bVar2 = 1 < (long)__n;
      __n = sVar1;
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector Utils::SolveUpperTriangle(const Matrix& m, const Vector& b)
{
    const int n = m.GetCols();
    Vector x(n);

    for (int i = n - 1; i >= 0; --i)
    {
        double sum = 0;
        for (int j = i + 1; j < n; ++j)
        {
            sum += x[j] * m(i, j);
        }
        x[i] = (b[i] - sum) / m(i, i);
    }

    return x;
}